

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O2

bool __thiscall Point::operator<(Point *this,Point *b)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  byte bVar4;
  
  bVar3 = operator==(this,b);
  if (!bVar3) {
    fVar1 = this->x;
    fVar2 = b->x;
    if ((fVar1 < fVar2) && (bVar4 = 1, 1e-08 < ABS(fVar1 - fVar2))) goto LAB_001053d7;
    if ((fVar1 <= fVar2) || (ABS(fVar2 - fVar1) <= 1e-08)) {
      bVar4 = -(1e-08 < ABS(this->y - b->y)) & -(this->y < b->y);
      goto LAB_001053d7;
    }
  }
  bVar4 = 0;
LAB_001053d7:
  return (bool)(bVar4 & 1);
}

Assistant:

bool Point::operator<(const Point &b) const {
    if (*this == b) {
        return false;
    }
    return float_lt(x,  b.x) || (!float_lt(b.x, x) && float_lt(y, b.y));
}